

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O0

void calc_mean_and_sd_weighted<float,std::vector<double,std::allocator<double>>,double>
               (size_t *ix_arr,size_t st,size_t end,float *x,
               vector<double,_std::allocator<double>_> *w,MissingAction missing_action,double *x_sd,
               double *x_mean)

{
  float fVar1;
  double __x;
  bool bVar2;
  uint uVar3;
  int iVar4;
  reference pvVar5;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  double __value;
  double *in_stack_00000008;
  size_t row;
  double xval;
  double m_prev;
  double s;
  double m;
  double w_this;
  double cnt;
  undefined1 local_6a;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_10;
  
  local_38 = 0.0;
  local_48 = 0.0;
  local_50 = 0.0;
  fVar1 = *(float *)(in_RCX + *(long *)(in_RDI + in_RSI * 8) * 4);
  local_10 = in_RSI;
  do {
    local_58 = (double)fVar1;
    uVar3 = std::isnan(local_58);
    if ((uVar3 & 1) == 0) {
      uVar3 = std::isinf(local_58);
      bVar2 = false;
      if ((uVar3 & 1) != 0) goto LAB_00479bc8;
    }
    else {
LAB_00479bc8:
      bVar2 = local_10 <= in_RDX;
    }
    if (!bVar2) {
      for (local_68 = local_10; local_68 <= in_RDX; local_68 = local_68 + 1) {
        __value = (double)*(float *)(in_RCX + *(long *)(in_RDI + local_68 * 8) * 4);
        uVar3 = std::isnan(__value);
        local_6a = 1;
        if ((uVar3 & 1) == 0) {
          iVar4 = std::isinf(__value);
          local_6a = (byte)iVar4;
        }
        if (((local_6a ^ 0xff) & 1) != 0) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_R8,*(size_type *)(in_RDI + local_68 * 8));
          __x = *pvVar5;
          local_38 = __x + local_38;
          local_48 = fma(__x,(__value - local_48) / local_38,local_48);
          local_50 = fma(__x,(__value - local_48) * (__value - local_58),local_50);
          local_58 = local_48;
        }
      }
      *(double *)row = local_48;
      *in_stack_00000008 = SQRT(local_50 / local_38);
      return;
    }
    fVar1 = *(float *)(in_RCX + *(long *)(in_RDI + 8 + local_10 * 8) * 4);
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

void calc_mean_and_sd_weighted(size_t ix_arr[], size_t st, size_t end, real_t_ *restrict x, mapping &restrict w,
                               MissingAction missing_action, double &restrict x_sd, double &restrict x_mean)
{
    ldouble_safe cnt = 0;
    ldouble_safe w_this;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = x[ix_arr[st]];
    ldouble_safe xval;
    while (is_na_or_inf(m_prev) && st <= end)
    {
        m_prev = x[ix_arr[++st]];
    }

    for (size_t row = st; row <= end; row++)
    {
        xval = x[ix_arr[row]];
        if (likely(!is_na_or_inf(xval)))
        {
            w_this = w[ix_arr[row]];
            cnt += w_this;
            m = std::fma(w_this, (xval - m) / cnt, m);
            s = std::fma(w_this, (xval - m) * (xval - m_prev), s);
            m_prev = m;
        }
    }

    x_mean = m;
    x_sd   = std::sqrt((ldouble_safe)s / (ldouble_safe)cnt);
}